

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteNLHeader
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this)

{
  File *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  int i;
  long lVar7;
  
  this_00 = &this->nm;
  File::Printf(this_00,"%c%d",
               (ulong)((uint)((this->header_).super_NLInfo.super_NLInfo_C.format == 0) * 5 + 0x62),
               (ulong)(uint)(this->header_).super_NLInfo.super_NLInfo_C.num_ampl_options);
  for (lVar7 = 0; lVar7 < (this->header_).super_NLInfo.super_NLInfo_C.num_ampl_options;
      lVar7 = lVar7 + 1) {
    File::Printf(this_00," %ld",(this->header_).super_NLInfo.super_NLInfo_C.ampl_options[lVar7]);
  }
  if ((this->header_).super_NLInfo.super_NLInfo_C.ampl_options[1] == 3) {
    File::Printf(this_00," %.g",(this->header_).super_NLInfo.super_NLInfo_C.ampl_vbtol);
  }
  File::Printf(this_00,"\t# problem %s\n",(this->header_).super_NLInfo.super_NLInfo_C.prob_name);
  File::Printf(this_00," %d %d %d %d %d",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_algebraic_cons,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_ranges,
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_eqns);
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_vars == 0) {
    if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons == 0) {
      pcVar4 = "";
    }
    else {
      File::Printf(this_00," %d");
      pcVar4 = ", lcons";
    }
  }
  else {
    File::Printf(this_00," %d %d");
    pcVar4 = ", lcons, randvars";
  }
  File::Printf(this_00,"\t# vars, algcons, objs, ranges, eqns%s\n",pcVar4);
  iVar1 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_compl_conds;
  uVar5 = (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_cons;
  uVar3 = (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs;
  if (((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_cons == 0 &&
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_objs == 0) && iVar1 == 0) {
    File::Printf(this_00," %d %d\t# nonlinear cons, objs\n",uVar5,uVar3);
  }
  else {
    uVar6 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_compl_conds;
    File::Printf(this_00," %d %d %d %d %d %d",uVar5,uVar3,(ulong)(iVar1 - uVar6),(ulong)uVar6,
                 (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_compl_dbl_ineqs,
                 (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_compl_vars_with_nz_lb
                );
    if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_objs == 0 &&
        (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_cons == 0) {
      pcVar4 = "";
    }
    else {
      File::Printf(this_00," %d %d");
      pcVar4 = "; rand constrs, objs";
    }
    File::Printf(this_00,"\t# nonlinear cons, objs; compl: lin, nonlin, range, nzlb%s\n",pcVar4);
  }
  File::Printf(this_00," %d %d",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_net_cons,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_linear_net_cons);
  pcVar4 = "\t# network cons: nonlinear, linear\n";
  if (1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_stages) {
    pcVar4 = " %d\t# network cons: nonlinear, linear; stages\n";
  }
  File::Printf(this_00,pcVar4);
  File::Printf(this_00," %d %d %d\t# nonlinear vars in cons, objs, both\n",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_vars_in_cons,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_vars_in_objs,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_vars_in_both);
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_vars == 0) {
    uVar6 = (this->header_).super_NLInfo.super_NLInfo_C.arith_kind;
    uVar2 = (this->header_).super_NLInfo.super_NLInfo_C.flags;
    uVar3 = (ulong)uVar2;
    pcVar4 = " %d %d %d %d\t# linear network vars; funcs; arith, flags\n";
    if (uVar6 == 0 && uVar2 == 0) {
      pcVar4 = " %d %d\t# linear network vars; funcs\n";
    }
  }
  else {
    uVar6 = (this->header_).super_NLInfo.super_NLInfo_C.arith_kind;
    uVar3 = (ulong)(uint)(this->header_).super_NLInfo.super_NLInfo_C.flags;
    pcVar4 = " %d %d %d %d %d\t# linear network vars; funcs; arith, flags; randcalls\n";
  }
  if ((this->header_).super_NLInfo.super_NLInfo_C.format == 0) {
    uVar6 = 0;
  }
  File::Printf(this_00,pcVar4,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_linear_net_vars,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_funcs,
               (ulong)uVar6,uVar3,
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_calls);
  File::Printf(this_00," %d %d %d %d %d\t# discrete vars: binary, integer, nonlinear (b,c,o)\n",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_linear_binary_vars,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_linear_integer_vars,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_integer_vars_in_both,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_nl_integer_vars_in_cons,
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs
              );
  File::Printf(this_00," %zd %zd\t# nonzeros in Jacobian, gradients\n",
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros,
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros);
  File::Printf(this_00," %d %d\t# max name lengths: cons/objs, vars\n",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            max_con_name_len,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            max_var_name_len);
  File::Printf(this_00," %d %d %d %d %d",
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_common_exprs_in_both,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_common_exprs_in_cons,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_common_exprs_in_objs,
               (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_common_exprs_in_single_cons,
               (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
               num_common_exprs_in_single_objs);
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_rand_common_exprs == 0) {
    pcVar4 = "";
  }
  else {
    File::Printf(this_00," %d");
    pcVar4 = ",rand";
  }
  File::Printf(this_00,"\t# common exprs: b,c,o,c1,o1%s\n",pcVar4);
  return;
}

Assistant:

void NLWriter2<Params>::WriteNLHeader() {
  assert(Formatter().Mode() == Hdr().format);

  /// But the header is always text.
  nm.Printf(gl_1__short,
            NLHeader::TEXT==Hdr().format ? 'g' : 'b',
            Hdr().num_ampl_options);
  for (int i = 0; i < Hdr().num_ampl_options; ++i)
    nm.Printf(" %ld", Hdr().ampl_options[i]);
  if (Hdr().ampl_options[VBTOL_OPTION_INDEX] == USE_VBTOL_FLAG)
    nm.Printf(" %.g", Hdr().ampl_vbtol);
  nm.Printf(gl_1a, Hdr().prob_name);

  /// Num variables, constraints, obj, ...
  nm.Printf(gl_2a,
            Hdr().num_vars,
            Hdr().num_algebraic_cons,
            Hdr().num_objs,
            Hdr().num_ranges,
            Hdr().num_eqns);
  const char* s = "";
  if (Hdr().num_rand_vars) {            /*SNL2006*/
    s = ", lcons, randvars";
    nm.Printf(" %d %d",
              Hdr().num_logical_cons,
              Hdr().num_rand_vars);
  }
  else if (Hdr().num_logical_cons) {
    s = ", lcons";
    nm.Printf(" %d", Hdr().num_logical_cons);
  }
  nm.Printf(gl_2, s);

  /// Nonlinear / random cons/obj
  if (Hdr().num_compl_conds |
      Hdr().num_rand_cons | Hdr().num_rand_objs) {
    nm.Printf(" %d %d %d %d %d %d",
              Hdr().num_nl_cons, Hdr().num_nl_objs,
              Hdr().num_compl_conds - Hdr().num_nl_compl_conds,
              Hdr().num_nl_compl_conds, Hdr().num_compl_dbl_ineqs,
              Hdr().num_compl_vars_with_nz_lb);
    s = "";
    if (Hdr().num_rand_cons | Hdr().num_rand_objs) {
      nm.Printf(" %d %d",
                Hdr().num_rand_cons, Hdr().num_rand_objs);
      s = "; rand constrs, objs";
    }
    nm.Printf(gl_3c, s);
  }
  else
    nm.Printf(gl_3, Hdr().num_nl_cons, Hdr().num_nl_objs);

  /// Network cons, stages
  nm.Printf(" %d %d",
            Hdr().num_nl_net_cons, Hdr().num_linear_net_cons);
  nm.Printf(Hdr().num_stages > 1 ? gl_4r : gl_4,
            Hdr().num_stages);

  /// NL vars in cons, objs, both
  nm.Printf(gl_5, Hdr().num_nl_vars_in_cons,
            Hdr().num_nl_vars_in_objs, Hdr().num_nl_vars_in_both);

  /// Linear network vars, functions, ak, flags, rnd calls
  const char* fmt =
      Hdr().num_rand_vars ? gl_6y :
                            Hdr().flags | Hdr().arith_kind ?
                              gl_6x : gl_6;
  nm.Printf(fmt, Hdr().num_linear_net_vars, Hdr().num_funcs,
            NLHeader::TEXT==Hdr().format ? 0 : Hdr().arith_kind,
            Hdr().flags, Hdr().num_rand_calls);

  /// Integer vars
  nm.Printf(gl_7, Hdr().num_linear_binary_vars,
            Hdr().num_linear_integer_vars,
            Hdr().num_nl_integer_vars_in_both,
            Hdr().num_nl_integer_vars_in_cons,
            Hdr().num_nl_integer_vars_in_objs);

  /// Nonzeros
  nm.Printf(gl_8, Hdr().num_con_nonzeros,
            Hdr().num_obj_nonzeros);

  /// Max name lengths
  nm.Printf(gl_9, Hdr().max_con_name_len,
            Hdr().max_var_name_len);

  /// Common exprs
  nm.Printf(" %d %d %d %d %d",
            Hdr().num_common_exprs_in_both,
            Hdr().num_common_exprs_in_cons,
            Hdr().num_common_exprs_in_objs,
            Hdr().num_common_exprs_in_single_cons,
            Hdr().num_common_exprs_in_single_objs);
  s = "";
  if (Hdr().num_rand_common_exprs) {       /*SNL2006*/
    nm.Printf(" %d", Hdr().num_rand_common_exprs);
    s = ",rand";
  }
  nm.Printf(gl_10, s);
}